

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwGetGamepadState(int jid,GLFWgamepadstate *state)

{
  uint8_t uVar1;
  byte bVar2;
  _GLFWmapping *p_Var3;
  int iVar4;
  long lVar5;
  uchar uVar6;
  int iVar7;
  float fVar8;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/src/input.c"
                  ,0x4cf,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (0xf < jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/src/input.c"
                  ,0x4d0,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (state == (GLFWgamepadstate *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/src/input.c"
                  ,0x4d1,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  state->axes[0] = 0.0;
  state->axes[1] = 0.0;
  state->axes[2] = 0.0;
  state->axes[3] = 0.0;
  state->buttons[0] = '\0';
  state->buttons[1] = '\0';
  state->buttons[2] = '\0';
  state->buttons[3] = '\0';
  state->buttons[4] = '\0';
  state->buttons[5] = '\0';
  state->buttons[6] = '\0';
  state->buttons[7] = '\0';
  *(undefined8 *)(state->buttons + 8) = 0;
  state->axes[4] = 0.0;
  state->axes[5] = 0.0;
  if (_glfw.initialized == 0) {
    iVar7 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    iVar7 = 0;
    if (((_glfw.joysticks[(uint)jid].present != 0) &&
        (iVar4 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,3), iVar7 = 0, iVar4 != 0))
       && (_glfw.joysticks[(uint)jid].mapping != (_GLFWmapping *)0x0)) {
      lVar5 = 0;
      do {
        p_Var3 = _glfw.joysticks[(uint)jid].mapping;
        uVar1 = p_Var3->buttons[lVar5].type;
        if (uVar1 == '\x03') {
          bVar2 = p_Var3->buttons[lVar5].index;
          uVar6 = '\x01';
          if ((_glfw.joysticks[(uint)jid].hats[bVar2 >> 4] & bVar2 & 0xf) != 0) goto LAB_0011a6a3;
        }
        else {
          if (uVar1 == '\x02') {
            uVar6 = _glfw.joysticks[(uint)jid].buttons[p_Var3->buttons[lVar5].index];
          }
          else if ((uVar1 != '\x01') ||
                  (uVar6 = '\x01',
                  (float)(int)p_Var3->buttons[lVar5].axisScale *
                  _glfw.joysticks[(uint)jid].axes[p_Var3->buttons[lVar5].index] +
                  (float)(int)p_Var3->buttons[lVar5].axisOffset <= 0.0)) goto LAB_0011a6a6;
LAB_0011a6a3:
          state->buttons[lVar5] = uVar6;
        }
LAB_0011a6a6:
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xf);
      lVar5 = 0;
      do {
        p_Var3 = _glfw.joysticks[(uint)jid].mapping;
        uVar1 = p_Var3->axes[lVar5].type;
        if (uVar1 == '\x03') {
          bVar2 = p_Var3->axes[lVar5].index;
          fVar8 = 1.0;
          if ((_glfw.joysticks[(uint)jid].hats[bVar2 >> 4] & bVar2 & 0xf) != 0) goto LAB_0011a767;
        }
        else {
          if (uVar1 == '\x02') {
            fVar8 = (float)_glfw.joysticks[(uint)jid].buttons[p_Var3->axes[lVar5].index];
          }
          else {
            if (uVar1 != '\x01') goto LAB_0011a76e;
            fVar8 = _glfw_fmaxf((float)(int)p_Var3->axes[lVar5].axisScale *
                                _glfw.joysticks[(uint)jid].axes[p_Var3->axes[lVar5].index] +
                                (float)(int)p_Var3->axes[lVar5].axisOffset,-1.0);
            fVar8 = _glfw_fminf(fVar8,1.0);
          }
LAB_0011a767:
          state->axes[lVar5] = fVar8;
        }
LAB_0011a76e:
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

GLFWAPI int glfwGetGamepadState(int jid, GLFWgamepadstate* state)
{
    int i;
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(state != NULL);

    memset(state, 0, sizeof(GLFWgamepadstate));

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_ALL))
        return GLFW_FALSE;

    if (!js->mapping)
        return GLFW_FALSE;

    for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->buttons + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            if (value > 0.f)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->buttons[i] = js->buttons[e->index];
    }

    for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
    {
        const _GLFWmapelement* e = js->mapping->axes + i;
        if (e->type == _GLFW_JOYSTICK_AXIS)
        {
            const float value = js->axes[e->index] * e->axisScale + e->axisOffset;
            state->axes[i] = _glfw_fminf(_glfw_fmaxf(value, -1.f), 1.f);
        }
        else if (e->type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = e->index >> 4;
            const unsigned int bit = e->index & 0xf;
            if (js->hats[hat] & bit)
                state->axes[i] = 1.f;
        }
        else if (e->type == _GLFW_JOYSTICK_BUTTON)
            state->axes[i] = (float) js->buttons[e->index];
    }

    return GLFW_TRUE;
}